

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void * handle_client(void *arg)

{
  int socket;
  bool bVar1;
  player_modes pVar2;
  int iVar3;
  ssize_t sVar4;
  ostream *poVar5;
  char cVar6;
  byte bVar7;
  _List_node_base *p_Var8;
  Player *this;
  ulong uVar9;
  bool client_connected;
  char temp;
  int col;
  int row;
  Player player;
  undefined1 local_300 [8];
  undefined1 local_2f8 [44];
  StatusCode status;
  undefined1 local_2c8 [48];
  undefined1 local_298 [48];
  undefined1 local_268 [47];
  char cStack_239;
  char buffer [512];
  
  socket = *arg;
  client_connected = true;
  temp = '\0';
  row = 0;
  col = 0;
  Player::Player(&player,socket);
  bVar7 = 1;
LAB_001037b6:
  do {
    do {
      while( true ) {
        if ((bVar7 & 1) == 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Player \"");
          Player::GetName_abi_cxx11_((string *)local_300,&player);
          poVar5 = std::operator<<(poVar5,(string *)local_300);
          poVar5 = std::operator<<(poVar5,"\" has disconnected");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)local_300);
          DisconnectPlayer(&player);
          close(socket);
          std::__cxx11::string::~string((string *)&player.m_name);
          return (void *)0x0;
        }
        pVar2 = Player::GetMode(&player);
        if (pVar2 != COMMAND) break;
        uVar9 = 0;
        cVar6 = '\0';
        while (((uVar9 < 0x1ff && (cVar6 != '\n')) && ((bVar7 & 1) != 0))) {
          sVar4 = read(socket,&temp,1);
          if (sVar4 == 0) {
            bVar7 = 0;
          }
          else {
            buffer[uVar9] = temp;
          }
          uVar9 = uVar9 + 1;
          cVar6 = temp;
        }
        temp = '\0';
        (buffer + (uVar9 - 1))[0] = '\0';
        (buffer + (uVar9 - 1))[1] = '\0';
        client_connected = (bool)bVar7;
        poVar5 = std::operator<<((ostream *)&std::cout,"Received command \"");
        poVar5 = std::operator<<(poVar5,buffer);
        poVar5 = std::operator<<(poVar5,"\" from ");
        Player::GetName_abi_cxx11_((string *)local_300,&player);
        poVar5 = std::operator<<(poVar5,(string *)local_300);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)local_300);
        buffer[uVar9 - 1] = '\n';
        bVar1 = ProcessCommand(buffer,&player,&client_connected);
        bVar7 = client_connected;
        if (!bVar1) {
          iVar3 = Player::GetSocket(&player);
          SendStatus(iVar3,INVALID_CMD);
          bVar7 = client_connected;
        }
      }
      pVar2 = Player::GetMode(&player);
      bVar7 = client_connected;
    } while (pVar2 != INGAME);
    pthread_mutex_lock((pthread_mutex_t *)&games_lock);
    p_Var8 = game_list_abi_cxx11_.super__List_base<TTTGame_*,_std::allocator<TTTGame_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    Player::Player((Player *)local_268,&player);
    Player::Player((Player *)local_298,(Player *)local_268);
    Player::Player((Player *)local_300,(Player *)local_298);
    Player::Player((Player *)local_2c8,(Player *)local_300);
    std::__cxx11::string::~string((string *)local_2f8);
    Player::Player((Player *)local_300,(Player *)local_2c8);
    for (; p_Var8 != (_List_node_base *)&game_list_abi_cxx11_;
        p_Var8 = (((_List_base<TTTGame_*,_std::allocator<TTTGame_*>_> *)&p_Var8->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next) {
      bVar1 = TTTGame::HasPlayer((TTTGame *)p_Var8[1]._M_next,(Player *)local_300);
      if (bVar1) {
        std::__cxx11::string::~string((string *)local_2f8);
        std::__cxx11::string::~string((string *)(local_2c8 + 8));
        std::__cxx11::string::~string((string *)(local_298 + 8));
        std::__cxx11::string::~string((string *)(local_268 + 8));
        pthread_mutex_unlock((pthread_mutex_t *)&games_lock);
        if (p_Var8 == (_List_node_base *)&game_list_abi_cxx11_) goto LAB_00103ab2;
        iVar3 = Player::GetSocket(&player);
        client_connected = ReceiveStatus(iVar3,&status);
        bVar7 = client_connected;
        if (!client_connected) goto LAB_001037b6;
        if (status == MOVE) {
          iVar3 = Player::GetSocket(&player);
          ReceiveInt(iVar3,&row);
          iVar3 = Player::GetSocket(&player);
          ReceiveInt(iVar3,&col);
          poVar5 = std::operator<<((ostream *)&std::cout,"Received moved from ");
          Player::GetName_abi_cxx11_((string *)local_300,&player);
          poVar5 = std::operator<<(poVar5,(string *)local_300);
          poVar5 = std::operator<<(poVar5,": row=");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,row);
          poVar5 = std::operator<<(poVar5,", col=");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,col);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)local_300);
          TTTGame::GetOtherPlayer((Player *)local_300,(TTTGame *)p_Var8[1]._M_next,&player);
          iVar3 = Player::GetSocket((Player *)local_300);
          SendStatus(iVar3,MOVE);
          std::__cxx11::string::~string((string *)local_2f8);
          TTTGame::GetOtherPlayer((Player *)local_300,(TTTGame *)p_Var8[1]._M_next,&player);
          iVar3 = Player::GetSocket((Player *)local_300);
          SendInt(iVar3,row);
          std::__cxx11::string::~string((string *)local_2f8);
          TTTGame::GetOtherPlayer((Player *)local_300,(TTTGame *)p_Var8[1]._M_next,&player);
          iVar3 = Player::GetSocket((Player *)local_300);
          client_connected = SendInt(iVar3,col);
          std::__cxx11::string::~string((string *)local_2f8);
          poVar5 = std::operator<<((ostream *)&std::cout,"Sent move to ");
          TTTGame::GetOtherPlayer((Player *)local_300,(TTTGame *)p_Var8[1]._M_next,&player);
          Player::GetName_abi_cxx11_((string *)local_2c8,(Player *)local_300);
          poVar5 = std::operator<<(poVar5,(string *)local_2c8);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)local_2c8);
          this = (Player *)local_2f8;
          goto LAB_00103afa;
        }
        if (status == WIN) {
          Player::GetName_abi_cxx11_((string *)local_2c8,&player);
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_2c8);
          poVar5 = std::operator<<(poVar5," won a game against ");
          TTTGame::GetOtherPlayer((Player *)local_300,(TTTGame *)p_Var8[1]._M_next,&player);
          Player::GetName_abi_cxx11_((string *)local_298,(Player *)local_300);
          poVar5 = std::operator<<(poVar5,(string *)local_298);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          if (status != DRAW) {
            iVar3 = Player::GetSocket(&player);
            client_connected = SendStatus(iVar3,INVALID_CMD);
            bVar7 = client_connected;
            goto LAB_001037b6;
          }
          Player::GetName_abi_cxx11_((string *)local_2c8,&player);
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_2c8);
          poVar5 = std::operator<<(poVar5," tied against ");
          TTTGame::GetOtherPlayer((Player *)local_300,(TTTGame *)p_Var8[1]._M_next,&player);
          Player::GetName_abi_cxx11_((string *)local_298,(Player *)local_300);
          poVar5 = std::operator<<(poVar5,(string *)local_298);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        std::__cxx11::string::~string((string *)local_298);
        std::__cxx11::string::~string((string *)local_2f8);
        std::__cxx11::string::~string((string *)local_2c8);
        client_connected = false;
        bVar7 = client_connected;
        goto LAB_001037b6;
      }
    }
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::string::~string((string *)(local_2c8 + 8));
    std::__cxx11::string::~string((string *)(local_298 + 8));
    std::__cxx11::string::~string((string *)(local_268 + 8));
    pthread_mutex_unlock((pthread_mutex_t *)&games_lock);
LAB_00103ab2:
    poVar5 = std::operator<<((ostream *)&std::cout,"Somehow Player ");
    Player::GetName_abi_cxx11_((string *)local_300,&player);
    poVar5 = std::operator<<(poVar5,(string *)local_300);
    poVar5 = std::operator<<(poVar5," isn\'t a part of a game but is INGAME");
    std::endl<char,std::char_traits<char>>(poVar5);
    this = (Player *)local_300;
LAB_00103afa:
    std::__cxx11::string::~string((string *)this);
    bVar7 = client_connected;
  } while( true );
}

Assistant:

void * handle_client(void * arg)
{
    int client_sock = *(int *)arg;
    char buffer[BUF_SIZE];
    bool client_connected = true;
    char temp = '\0';
    int row = 0, col = 0;
    int i = 0;

    // Create the player
    Player player(client_sock);

    // Always handle the client
    while(client_connected)
    {
        // Process commands or pass game data
        if(player.GetMode() == COMMAND)
        {
            // Read a line of text or until the buffer is full
            for(i = 0; (i < (BUF_SIZE - 1)) && temp != '\n' && client_connected; ++i)
            {
                // Receive a single character and make sure the client is still connected
                if(read(client_sock, &temp, 1) == 0)
                    client_connected = false;
                else
                    buffer[i] = temp;
            }

            // Reset temp so we don't get an infinite loop
            temp = '\0';
            buffer[i] = '\0';
            buffer[i - 1] = '\0';
            cout << "Received command \"" << buffer << "\" from " << player.GetName() << endl;
            buffer[i - 1] = '\n';

            // If there's an invalid command, tell the client
            if(!ProcessCommand(buffer, player, client_connected))
                SendStatus(player.GetSocket(), INVALID_CMD);
        }
        else if (player.GetMode() == INGAME)
        {
            // Get the game the player is a part of
            pthread_mutex_lock(&games_lock);
            auto game = find_if(game_list.begin(), game_list.end(),
                      [player] (TTTGame * game) { return game->HasPlayer(player); });
            auto end = game_list.end();
            pthread_mutex_unlock(&games_lock);

            // Something horrible has gone wrong
            if(game == end)
                cout << "Somehow Player " << player.GetName() << " isn't a part of a game but is INGAME" << endl;
            else
            {
                StatusCode status;
                client_connected = ReceiveStatus(player.GetSocket(), &status);

                // If the player is still connected, then perform the move
                if(client_connected)
                {
                    switch(status)
                    {
                        case MOVE:
                            // Pass the row and column right along
                            ReceiveInt(player.GetSocket(), &row);
                            ReceiveInt(player.GetSocket(), &col);
                            cout << "Received moved from " << player.GetName()
                                 << ": row=" << row << ", col=" << col << endl;

                            SendStatus((*game)->GetOtherPlayer(player).GetSocket(), MOVE);
                            SendInt((*game)->GetOtherPlayer(player).GetSocket(), row);
                            client_connected = SendInt((*game)->GetOtherPlayer(player).GetSocket(), col);
                            cout << "Sent move to " << (*game)->GetOtherPlayer(player).GetName() << endl;

                            break;
                        case WIN:
                            cout << player.GetName() << " won a game against " << (*game)->GetOtherPlayer(player).GetName() << endl;
                            client_connected = false;
                            break;
                        case DRAW:
                            cout << player.GetName() << " tied against " << (*game)->GetOtherPlayer(player).GetName() << endl;
                            client_connected = false;
                            break;
                        default:
                            client_connected = SendStatus(player.GetSocket(), INVALID_CMD);
                    }
                }
            }
        }
    }

    // The client disconnected on us D:
    cout << "Player \"" << player.GetName() << "\" has disconnected" << endl;
    DisconnectPlayer(player);
    close(client_sock);

    return (void *)0;
}